

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcLut.c
# Opt level: O3

int Abc_NtkSuperChoiceLut(Abc_Ntk_t *pNtk,int nLutSize,int nCutSizeMax,int fVerbose)

{
  size_t __n;
  char cVar1;
  char cVar2;
  int iVar;
  Abc_Obj_t *pAVar3;
  Vec_Ptr_t *vVolume;
  uint *puVar4;
  Abc_Ntk_t *pNtk_00;
  uint *puVar5;
  uint *puVar6;
  void **ppvVar7;
  uint uVar8;
  long lVar9;
  Abc_ManScl_t *pManScl;
  uint **ppuVar10;
  uint **ppuVar11;
  ulong uVar12;
  Cut_Man_t *p;
  Vec_Int_t *vFanCounts;
  Abc_ManCut_t *p_00;
  Vec_Ptr_t *pVVar13;
  ProgressBar *p_01;
  void *pvVar14;
  uint *puVar15;
  Abc_Obj_t *pAVar16;
  char *pcVar17;
  byte bVar18;
  uint uVar19;
  uint uVar20;
  uint uVar21;
  uint uVar22;
  ulong uVar23;
  ulong uVar24;
  ulong uVar25;
  long lVar26;
  int iVar27;
  int iVar28;
  int iVar29;
  int iVar30;
  ulong uVar31;
  long *plVar32;
  long lVar33;
  uint uVar34;
  ulong uVar35;
  int *pBSet;
  ulong uVar36;
  uint **local_140;
  uint local_110;
  uint local_10c;
  uint local_108;
  uint local_104;
  ulong local_f0;
  ulong local_c8;
  undefined8 auStack_68 [7];
  
  if ((pNtk->ntkFunc != ABC_FUNC_SOP) || (pNtk->ntkType != ABC_NTK_LOGIC)) {
    __assert_fail("Abc_NtkIsSopLogic(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcLut.c"
                  ,0x5b,"int Abc_NtkSuperChoiceLut(Abc_Ntk_t *, int, int, int)");
  }
  uVar23 = (ulong)(uint)nLutSize;
  if (nLutSize - 7U < 0xfffffffc) {
    iVar30 = 0;
    printf("LUT size (%d) does not belong to the interval: 3 <= LUT size <= %d\n",uVar23,6);
  }
  else if (nCutSizeMax < 0x10 && nLutSize < nCutSizeMax) {
    pVVar13 = pNtk->vCis;
    if (0 < pVVar13->nSize) {
      lVar9 = 0;
      do {
        puVar15 = (uint *)((long)pVVar13->pArray[lVar9] + 0x14);
        *puVar15 = *puVar15 & 0xfff;
        lVar9 = lVar9 + 1;
        pVVar13 = pNtk->vCis;
      } while (lVar9 < pVVar13->nSize);
    }
    pManScl = (Abc_ManScl_t *)calloc(1,0x80);
    pManScl->nLutSize = nLutSize;
    pManScl->nCutSizeMax = nCutSizeMax;
    pManScl->nNodesMax = 1000;
    bVar18 = (char)nCutSizeMax - 5;
    iVar28 = 1 << (bVar18 & 0x1f);
    if (nCutSizeMax < 6) {
      iVar28 = 1;
    }
    pManScl->nWords = iVar28;
    if (nCutSizeMax < 6) {
      bVar18 = 0;
    }
    ppuVar10 = (uint **)Extra_ArrayAlloc(nCutSizeMax,iVar28,4);
    pManScl->uVars = ppuVar10;
    ppuVar11 = (uint **)Extra_ArrayAlloc(1000,iVar28,4);
    pManScl->uSims = ppuVar11;
    local_140 = (uint **)Extra_ArrayAlloc(2 << ((byte)nLutSize & 0x1f),iVar28,4);
    pManScl->uCofs = local_140;
    memset(*ppuVar10,0,(long)((nCutSizeMax << (bVar18 & 0x1f)) << 2));
    if (0 < nCutSizeMax) {
      uVar20 = iVar28 * 0x20;
      if (iVar28 * 0x20 < 2) {
        uVar20 = 1;
      }
      uVar12 = 0;
      do {
        if (0 < iVar28) {
          uVar19 = 0;
          do {
            if ((uVar19 & 1 << ((byte)uVar12 & 0x1f)) != 0) {
              ppuVar10[uVar12][uVar19 >> 5] =
                   ppuVar10[uVar12][uVar19 >> 5] | 1 << ((byte)uVar19 & 0x1f);
            }
            uVar19 = uVar19 + 1;
          } while (uVar20 != uVar19);
        }
        uVar12 = uVar12 + 1;
      } while (uVar12 != (uint)nCutSizeMax);
    }
    Abc_NtkStartCutManForScl_Params._32_8_ = 0;
    Abc_NtkStartCutManForScl_Params._56_8_ = 0;
    Abc_NtkStartCutManForScl_Params._64_8_ = 0;
    Abc_NtkStartCutManForScl_Params._40_8_ = 0;
    Abc_NtkStartCutManForScl_Params._48_8_ = 0;
    Abc_NtkStartCutManForScl_Params._16_8_ = 0;
    Abc_NtkStartCutManForScl_Params._72_8_ = 0;
    Abc_NtkStartCutManForScl_Params._4_4_ = 500;
    Abc_NtkStartCutManForScl_Params._24_8_ = 1;
    Abc_NtkStartCutManForScl_Params._12_4_ = 0;
    Abc_NtkStartCutManForScl_Params._8_4_ = pNtk->vObjs->nSize;
    Abc_NtkStartCutManForScl_Params._0_4_ = nLutSize;
    p = Cut_ManStart((Cut_Params_t *)Abc_NtkStartCutManForScl_Params);
    if (Abc_NtkStartCutManForScl_Params._32_4_ != 0) {
      vFanCounts = Abc_NtkFanoutCounts(pNtk);
      Cut_ManSetFanoutCounts(p,vFanCounts);
    }
    pVVar13 = pNtk->vCis;
    if (0 < pVVar13->nSize) {
      lVar9 = 0;
      do {
        if (0 < *(int *)((long)pVVar13->pArray[lVar9] + 0x2c)) {
          Cut_NodeSetTriv(p,*(int *)((long)pVVar13->pArray[lVar9] + 0x10));
          pVVar13 = pNtk->vCis;
        }
        lVar9 = lVar9 + 1;
      } while (lVar9 < pVVar13->nSize);
    }
    p_00 = Abc_NtkManCutStart(nCutSizeMax,100000,100000,100000);
    s_pLeaves = Abc_NtkManCutReadCutSmall(p_00);
    pVVar13 = Abc_NtkManCutReadVisited(p_00);
    pManScl->vVolume = pVVar13;
    iVar28 = pNtk->vObjs->nSize;
    p_01 = Extra_ProgressBarStart(_stdout,iVar28);
    pVVar13 = pNtk->vObjs;
    if (pVVar13->nSize < 1) {
      local_104 = 0;
      local_108 = 0;
      local_10c = 0;
      local_110 = 0;
    }
    else {
      pBSet = pManScl->pBSet;
      lVar9 = 0;
      local_110 = 0;
      local_10c = 0;
      local_108 = 0;
      local_104 = 0;
      do {
        pAVar3 = (Abc_Obj_t *)pVVar13->pArray[lVar9];
        if (pAVar3 != (Abc_Obj_t *)0x0) {
          if ((p_01 == (ProgressBar *)0x0) || (p_01->nItemsNext <= lVar9)) {
            Extra_ProgressBarUpdate_int(p_01,(int)lVar9,(char *)0x0);
          }
          if (iVar28 <= lVar9) break;
          if ((pAVar3->vFanins).nSize == 2) {
            pvVar14 = Abc_NodeGetCutsRecursive(p,pAVar3,0,0);
            if (pvVar14 == (void *)0x0) {
              __assert_fail("pCut != NULL",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcLut.c"
                            ,0xd8,"void Abc_NodeLutMap(Cut_Man_t *, Abc_Obj_t *)");
            }
            if (0xfff < *(uint *)&pAVar3->field_0x14) {
              __assert_fail("pObj->Level == 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcLut.c"
                            ,0xd9,"void Abc_NodeLutMap(Cut_Man_t *, Abc_Obj_t *)");
            }
            uVar20 = *(uint *)&pAVar3->field_0x14 | 0xf4240000;
            *(uint *)&pAVar3->field_0x14 = uVar20;
            puVar15 = *(uint **)((long)pvVar14 + 0x10);
            if (puVar15 == (uint *)0x0) {
LAB_002696fc:
              __assert_fail("pObj->Level < LARGE_LEVEL",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcLut.c"
                            ,0xe9,"void Abc_NodeLutMap(Cut_Man_t *, Abc_Obj_t *)");
            }
            local_104 = local_104 + 1;
            do {
              uVar19 = 0;
              if (0xfffffff < *puVar15) {
                pVVar13 = pAVar3->pNtk->vObjs;
                uVar12 = 0;
                uVar19 = 0;
                do {
                  uVar34 = puVar15[uVar12 + 6];
                  if (((long)(int)uVar34 < 0) || (pVVar13->nSize <= (int)uVar34)) goto LAB_00269680;
                  uVar34 = *(uint *)((long)pVVar13->pArray[(int)uVar34] + 0x14) >> 0xc;
                  if (uVar19 <= uVar34) {
                    uVar19 = uVar34;
                  }
                  uVar12 = uVar12 + 1;
                } while (*puVar15 >> 0x1c != uVar12);
              }
              if (uVar19 < uVar20 >> 0xc) {
                uVar20 = uVar20 & 0xfff | uVar19 << 0xc;
                *(uint *)&pAVar3->field_0x14 = uVar20;
              }
              puVar15 = *(uint **)(puVar15 + 4);
            } while (puVar15 != (uint *)0x0);
            if (0xf423ffff < uVar20) goto LAB_002696fc;
            *(uint *)&pAVar3->field_0x14 = uVar20 + 0x1000;
            pVVar13 = Abc_NodeFindCut(p_00,pAVar3,0);
            pManScl->vLeaves = pVVar13;
            if ((nLutSize < pVVar13->nSize) && (vVolume = pManScl->vVolume, vVolume->nSize < 0x3e9))
            {
              Abc_NodeSuperChoiceCollect2(pAVar3,pVVar13,vVolume);
              if ((long)vVolume->nSize < 1) {
                __assert_fail("p->nSize > 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                              ,0x1b7,"void *Vec_PtrEntryLast(Vec_Ptr_t *)");
              }
              if ((Abc_Obj_t *)vVolume->pArray[(long)vVolume->nSize + -1] != pAVar3) {
                __assert_fail("Vec_PtrEntryLast(p->vVolume) == pObj",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcLut.c"
                              ,0x21b,
                              "Abc_Obj_t *Abc_NodeSuperChoiceLut(Abc_ManScl_t *, Abc_Obj_t *)");
              }
              puVar15 = Abc_NodeSuperChoiceTruth(pManScl);
              pManScl->uTruth = puVar15;
              uVar20 = pVVar13->nSize;
              uVar19 = Extra_TruthSupport(puVar15,uVar20);
              uVar34 = (uVar19 >> 1 & 0x55555555) + (uVar19 & 0x55555555);
              uVar34 = (uVar34 >> 2 & 0x33333333) + (uVar34 & 0x33333333);
              uVar34 = (uVar34 >> 4 & 0x7070707) + (uVar34 & 0x7070707);
              uVar34 = (uVar34 >> 8 & 0xf000f) + (uVar34 & 0xf000f);
              uVar34 = (uVar34 >> 0x10) + (uVar34 & 0xffff);
              if ((int)uVar20 < (int)uVar34) {
                __assert_fail("nSuppVars <= nVars",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcLut.c"
                              ,0x222,
                              "Abc_Obj_t *Abc_NodeSuperChoiceLut(Abc_ManScl_t *, Abc_Obj_t *)");
              }
              local_108 = local_108 + 1;
              if (uVar34 == 0) {
                *(uint *)&pAVar3->field_0x14 = *(uint *)&pAVar3->field_0x14 & 0xfff;
              }
              else if (uVar34 == 1) {
                if (uVar20 == 0) {
LAB_002696be:
                  __assert_fail("i < nVars",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcLut.c"
                                ,0x22e,
                                "Abc_Obj_t *Abc_NodeSuperChoiceLut(Abc_ManScl_t *, Abc_Obj_t *)");
                }
                lVar26 = 0;
                while ((uVar19 >> ((uint)lVar26 & 0x1f) & 1) == 0) {
                  lVar26 = lVar26 + 1;
                  if (uVar20 == (uint)lVar26) goto LAB_002696be;
                }
                if (pVVar13->nSize <= (int)(uint)lVar26) {
LAB_00269680:
                  __assert_fail("i >= 0 && i < p->nSize",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                                ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
                }
                *(uint *)&pAVar3->field_0x14 =
                     *(uint *)&pAVar3->field_0x14 & 0xfff |
                     *(uint *)((long)pVVar13->pArray[lVar26] + 0x14) & 0xfffff000;
              }
              else {
                if (uVar34 != uVar20) {
                  Extra_TruthShrink(*local_140,puVar15,uVar34,uVar20,uVar19);
                  uVar34 = 1 << ((byte)uVar20 - 5 & 0x1f);
                  if (uVar20 < 6) {
                    uVar34 = 1;
                  }
                  if (0 < (int)uVar34) {
                    puVar4 = *local_140;
                    uVar12 = (ulong)uVar34 + 1;
                    do {
                      puVar15[uVar12 - 2] = puVar4[uVar12 - 2];
                      uVar12 = uVar12 - 1;
                    } while (1 < uVar12);
                  }
                  Abc_NodeLeavesRemove(pVVar13,~(-1 << ((byte)uVar20 & 0x1f) | uVar19),uVar20);
                }
                uVar20 = pVVar13->nSize;
                if ((int)uVar23 < (int)uVar20) {
                  do {
                    if ((int)uVar20 < 1) goto LAB_00269680;
                    pNtk_00 = ((Abc_Obj_t *)*pVVar13->pArray)->pNtk;
                    Abc_NodeDecomposeSort((Abc_Obj_t **)pVVar13->pArray,uVar20,pBSet,(int)uVar23);
                    iVar30 = pManScl->pBSet[0];
                    if ((long)iVar30 < 0) goto LAB_00269680;
                    pVVar13 = pManScl->vLeaves;
                    if (pVVar13->nSize <= iVar30) goto LAB_00269680;
                    uVar19 = pManScl->pBSet[1];
                    if (((long)(int)uVar19 < 0) || ((uint)pVVar13->nSize <= uVar19))
                    goto LAB_00269680;
                    if (*(uint *)((long)pVVar13->pArray[(int)uVar19] + 0x14) >> 0xc <
                        *(uint *)((long)pVVar13->pArray[iVar30] + 0x14) >> 0xc) {
                      __assert_fail("((Abc_Obj_t *)Vec_PtrEntry(p->vLeaves, p->pBSet[0]))->Level <= ((Abc_Obj_t *)Vec_PtrEntry(p->vLeaves, p->pBSet[1]))->Level"
                                    ,
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcLut.c"
                                    ,0x2ae,"int Abc_NodeDecomposeStep(Abc_ManScl_t *)");
                    }
                    puVar15 = pManScl->uTruth;
                    local_140 = pManScl->uCofs;
                    uVar19 = 1 << ((byte)uVar20 - 5 & 0x1f);
                    if (uVar20 < 6) {
                      uVar19 = 1;
                    }
                    uVar12 = (ulong)uVar19;
                    if (0 < (int)uVar19) {
                      puVar4 = local_140[1];
                      uVar23 = uVar12 + 1;
                      do {
                        puVar4[uVar23 - 2] = puVar15[uVar23 - 2];
                        uVar23 = uVar23 - 1;
                      } while (1 < uVar23);
                    }
                    iVar30 = pManScl->nLutSize;
                    uVar23 = (ulong)iVar30;
                    if ((long)uVar23 < 1) {
                      iVar27 = 2;
                    }
                    else {
                      uVar36 = 2;
                      uVar25 = 0;
                      do {
                        if (uVar25 != 0x1f) {
                          iVar27 = 1 << ((byte)uVar25 & 0x1f);
                          uVar36 = (ulong)(int)uVar36;
                          if (iVar27 < 2) {
                            iVar27 = 1;
                          }
                          iVar = pBSet[uVar25];
                          iVar29 = 0;
                          do {
                            puVar4 = local_140[uVar36];
                            if (0 < (int)uVar19) {
                              puVar5 = local_140[(int)(((uint)(uVar36 >> 0x1f) & 1) + (int)uVar36)
                                                 >> 1];
                              uVar24 = uVar12 + 1;
                              do {
                                puVar4[uVar24 - 2] = puVar5[uVar24 - 2];
                                uVar24 = uVar24 - 1;
                              } while (1 < uVar24);
                              puVar6 = local_140[uVar36 + 1];
                              uVar24 = uVar12 + 1;
                              do {
                                puVar6[uVar24 - 2] = puVar5[uVar24 - 2];
                                uVar24 = uVar24 - 1;
                              } while (1 < uVar24);
                            }
                            Extra_TruthCofactor0(puVar4,uVar20,iVar);
                            Extra_TruthCofactor1(local_140[uVar36 + 1],uVar20,iVar);
                            uVar36 = uVar36 + 2;
                            iVar29 = iVar29 + 1;
                          } while (iVar29 != iVar27);
                        }
                        iVar27 = (int)uVar36;
                        uVar25 = uVar25 + 1;
                      } while (uVar25 != uVar23);
                    }
                    bVar18 = (byte)iVar30;
                    if (iVar27 != 2 << (bVar18 & 0x1f)) {
                      __assert_fail("c == (2 << p->nLutSize)",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcLut.c"
                                    ,699,"int Abc_NodeDecomposeStep(Abc_ManScl_t *)");
                    }
                    uVar8 = 1 << (bVar18 & 0x1f);
                    local_f0 = 0;
                    uVar34 = 0;
                    if (iVar30 != 0x1f) {
                      uVar25 = 1;
                      if (1 < (int)uVar8) {
                        uVar25 = (ulong)uVar8;
                      }
                      uVar36 = 0;
                      local_f0 = 0;
                      do {
                        uVar24 = 0;
                        iVar27 = (int)local_f0;
                        if (iVar27 < 1) {
LAB_00268df7:
                          if ((int)uVar24 == iVar27) goto LAB_00268dfb;
                        }
                        else {
                          uVar24 = 0;
                          do {
                            uVar35 = uVar12;
                            do {
                              if ((int)uVar35 < 1) {
                                cVar1 = (&Abc_NodeDecomposeStep_nCofClasses)[uVar24];
                                (&Abc_NodeDecomposeStep_nCofClasses)[uVar24] = cVar1 + '\x01';
                                (&Abc_NodeDecomposeStep_pCofClasses)[(long)cVar1 + uVar24 * 0x40] =
                                     (char)uVar36;
                                goto LAB_00268df7;
                              }
                              lVar26 = uVar35 - 1;
                              lVar33 = uVar35 - 1;
                              uVar35 = uVar35 - 1;
                            } while (local_140[(long)(int)uVar8 + uVar36][lVar26] ==
                                     local_140[(long)(char)(&Abc_NodeDecomposeStep_pCofClasses)
                                                           [uVar24 * 0x40] + (long)(int)uVar8]
                                     [lVar33]);
                            uVar24 = uVar24 + 1;
                          } while (uVar24 != local_f0);
LAB_00268dfb:
                          (&Abc_NodeDecomposeStep_nCofClasses)[iVar27] = 1;
                          (&Abc_NodeDecomposeStep_pCofClasses)[(long)iVar27 * 0x40] = (char)uVar36;
                          if ((int)uVar8 / 2 <= iVar27) {
                            iVar30 = pVVar13->nSize;
                            if (0 < iVar30) {
                              lVar26 = 0;
                              do {
                                pAVar3 = (Abc_Obj_t *)pVVar13->pArray[lVar26];
                                if (((*(uint *)&pAVar3->field_0x14 & 0xf) == 7) &&
                                   ((pAVar3->vFanouts).nSize == 0)) {
                                  Abc_NtkDeleteObj_rec(pAVar3,1);
                                  iVar30 = pVVar13->nSize;
                                }
                                lVar26 = lVar26 + 1;
                              } while (lVar26 < iVar30);
                            }
                            goto LAB_00268921;
                          }
                          local_f0 = (ulong)(iVar27 + 1);
                        }
                        uVar36 = uVar36 + 1;
                      } while (uVar36 != uVar25);
                      uVar22 = (uint)local_f0;
                      uVar34 = 0x1f;
                      if (uVar22 - 1 != 0) {
                        for (; uVar22 - 1 >> uVar34 == 0; uVar34 = uVar34 - 1) {
                        }
                      }
                      uVar34 = (uVar34 ^ 0xffffffe0) + 0x21;
                      if (uVar22 < 2) {
                        uVar34 = uVar22;
                      }
                    }
                    if (iVar30 <= (int)uVar34) {
                      __assert_fail("nVarsNew < p->nLutSize",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcLut.c"
                                    ,0x2d6,"int Abc_NodeDecomposeStep(Abc_ManScl_t *)");
                    }
                    if (0 < (int)uVar19) {
                      memset(puVar15,0,uVar12 * 4);
                    }
                    if (0 < (int)local_f0) {
                      ppuVar10 = pManScl->uVars;
                      uVar25 = uVar12 + 1;
                      uVar36 = 0;
                      do {
                        puVar4 = local_140[(long)(char)(&Abc_NodeDecomposeStep_pCofClasses)
                                                       [uVar36 * 0x40] + (long)(int)uVar8];
                        uVar24 = 0;
                        do {
                          puVar5 = ppuVar10[pBSet[uVar24]];
                          if (((uint)uVar36 >> ((uint)uVar24 & 0x1f) & 1) == 0) {
                            uVar35 = uVar25;
                            if (0 < (int)uVar19) {
                              do {
                                puVar4[uVar35 - 2] = puVar4[uVar35 - 2] & ~puVar5[uVar35 - 2];
                                uVar35 = uVar35 - 1;
                              } while (1 < uVar35);
                            }
                          }
                          else {
                            uVar35 = uVar25;
                            if (0 < (int)uVar19) {
                              do {
                                puVar4[uVar35 - 2] = puVar4[uVar35 - 2] & puVar5[uVar35 - 2];
                                uVar35 = uVar35 - 1;
                              } while (1 < uVar35);
                            }
                          }
                          uVar24 = uVar24 + 1;
                        } while (uVar24 != uVar34 + (uVar34 == 0));
                        uVar24 = uVar25;
                        if (0 < (int)uVar19) {
                          do {
                            puVar15[uVar24 - 2] = puVar15[uVar24 - 2] | puVar4[uVar24 - 2];
                            uVar24 = uVar24 - 1;
                          } while (1 < uVar24);
                        }
                        uVar36 = uVar36 + 1;
                      } while (uVar36 != local_f0);
                    }
                    if (0 < (int)uVar34) {
                      puVar4 = *local_140;
                      uVar8 = 1 << (bVar18 - 5 & 0x1f);
                      if (iVar30 < 6) {
                        uVar8 = 1;
                      }
                      __n = (ulong)uVar8 * 4;
                      uVar36 = (ulong)(iVar30 + (uint)(iVar30 == 0));
                      uVar25 = (ulong)uVar8 + 1;
                      local_c8 = 0;
                      do {
                        if (0 < (int)uVar8) {
                          memset(puVar4,0,__n);
                        }
                        if (0 < (int)local_f0) {
                          uVar24 = 0;
                          do {
                            if (((1 << ((byte)local_c8 & 0x1f) & (uint)uVar24) != 0) &&
                               (cVar1 = (&Abc_NodeDecomposeStep_nCofClasses)[uVar24],
                               0 < (long)cVar1)) {
                              puVar5 = local_140[1];
                              ppuVar10 = pManScl->uVars;
                              lVar26 = 0;
                              do {
                                if (0 < (int)uVar8) {
                                  memset(puVar5,0xff,__n);
                                }
                                cVar2 = (&Abc_NodeDecomposeStep_pCofClasses)[lVar26 + uVar24 * 0x40]
                                ;
                                uVar35 = 0;
                                do {
                                  puVar6 = ppuVar10[uVar35];
                                  if (((uint)(int)cVar2 >> (~(uint)uVar35 + iVar30 & 0x1f) & 1) == 0
                                     ) {
                                    uVar31 = uVar25;
                                    if (0 < (int)uVar8) {
                                      do {
                                        puVar5[uVar31 - 2] =
                                             puVar5[uVar31 - 2] & ~puVar6[uVar31 - 2];
                                        uVar31 = uVar31 - 1;
                                      } while (1 < uVar31);
                                    }
                                  }
                                  else {
                                    uVar31 = uVar25;
                                    if (0 < (int)uVar8) {
                                      do {
                                        puVar5[uVar31 - 2] = puVar5[uVar31 - 2] & puVar6[uVar31 - 2]
                                        ;
                                        uVar31 = uVar31 - 1;
                                      } while (1 < uVar31);
                                    }
                                  }
                                  uVar35 = uVar35 + 1;
                                } while (uVar35 != uVar36);
                                uVar35 = uVar25;
                                if (0 < (int)uVar8) {
                                  do {
                                    puVar4[uVar35 - 2] = puVar4[uVar35 - 2] | puVar5[uVar35 - 2];
                                    uVar35 = uVar35 - 1;
                                  } while (1 < uVar35);
                                }
                                lVar26 = lVar26 + 1;
                              } while (lVar26 != cVar1);
                            }
                            uVar24 = uVar24 + 1;
                          } while (uVar24 != local_f0);
                        }
                        pAVar16 = Abc_NtkCreateObj(pNtk_00,ABC_OBJ_NODE);
                        uVar24 = 0;
                        do {
                          iVar27 = pBSet[uVar24];
                          if (((long)iVar27 < 0) || (pVVar13->nSize <= iVar27)) goto LAB_00269680;
                          Abc_ObjAddFanin(pAVar16,(Abc_Obj_t *)pVVar13->pArray[iVar27]);
                          uVar24 = uVar24 + 1;
                        } while (uVar36 != uVar24);
                        pcVar17 = Abc_SopCreateFromTruth
                                            ((Mem_Flex_t *)pNtk_00->pManFunc,iVar30,puVar4);
                        (pAVar16->field_5).pData = pcVar17;
                        lVar26 = (long)(pAVar16->vFanins).nSize;
                        if (lVar26 < 1) {
                          uVar22 = 0x1000;
                        }
                        else {
                          lVar33 = 0;
                          uVar22 = 0;
                          do {
                            uVar21 = *(uint *)((long)pAVar16->pNtk->vObjs->pArray
                                                     [(pAVar16->vFanins).pArray[lVar33]] + 0x14) >>
                                     0xc;
                            if (uVar21 < uVar22) {
                              uVar21 = uVar22;
                            }
                            uVar22 = uVar21;
                            lVar33 = lVar33 + 1;
                          } while (lVar26 != lVar33);
                          uVar22 = uVar22 * 0x1000 + 0x1000;
                        }
                        *(uint *)&pAVar16->field_0x14 =
                             *(uint *)&pAVar16->field_0x14 & 0xfff | uVar22;
                        auStack_68[local_c8] = pAVar16;
                        local_c8 = local_c8 + 1;
                      } while (local_c8 != uVar34);
                      uVar25 = 0;
                      do {
                        iVar27 = pBSet[uVar25];
                        if (((long)iVar27 < 0) || (pVVar13->nSize <= iVar27)) {
                          __assert_fail("i >= 0 && i < p->nSize",
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                                        ,0x1a6,"void Vec_PtrWriteEntry(Vec_Ptr_t *, int, void *)");
                        }
                        pVVar13->pArray[iVar27] = (void *)auStack_68[uVar25];
                        uVar25 = uVar25 + 1;
                      } while (uVar34 != uVar25);
                    }
                    uVar25 = (ulong)(int)uVar34;
                    uVar8 = 0;
                    do {
                      uVar8 = uVar8 | 1 << ((byte)pBSet[uVar25] & 0x1f);
                      uVar25 = uVar25 + 1;
                    } while (uVar23 != uVar25);
                    Abc_NodeLeavesRemove(pVVar13,uVar8,uVar20);
                    iVar27 = (uVar20 - iVar30) + uVar34;
                    Extra_TruthShrink(*local_140,puVar15,iVar27,uVar20,
                                      ~(-1 << ((byte)uVar20 & 0x1f) | uVar8));
                    if (0 < (int)uVar19) {
                      puVar4 = *local_140;
                      uVar12 = uVar12 + 1;
                      do {
                        puVar15[uVar12 - 2] = puVar4[uVar12 - 2];
                        uVar12 = uVar12 - 1;
                      } while (1 < uVar12);
                    }
                    iVar27 = Extra_TruthVarInSupport(puVar15,uVar20,iVar27);
                    if (iVar27 != 0) {
                      __assert_fail("!Extra_TruthVarInSupport( p->uTruth, nVars, nVars - p->nLutSize + nVarsNew )"
                                    ,
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcLut.c"
                                    ,0x30e,"int Abc_NodeDecomposeStep(Abc_ManScl_t *)");
                    }
                    uVar20 = pVVar13->nSize;
                  } while (iVar30 < (int)uVar20);
                }
                pAVar16 = Abc_NtkCreateObj(pAVar3->pNtk,ABC_OBJ_NODE);
                iVar30 = pVVar13->nSize;
                if (0 < iVar30) {
                  lVar26 = 0;
                  do {
                    Abc_ObjAddFanin(pAVar16,(Abc_Obj_t *)pVVar13->pArray[lVar26]);
                    lVar26 = lVar26 + 1;
                    iVar30 = pVVar13->nSize;
                  } while (lVar26 < iVar30);
                }
                pcVar17 = Abc_SopCreateFromTruth
                                    ((Mem_Flex_t *)pAVar3->pNtk->pManFunc,iVar30,puVar15);
                (pAVar16->field_5).pData = pcVar17;
                lVar26 = (long)(pAVar16->vFanins).nSize;
                if (lVar26 < 1) {
                  uVar20 = 0x1000;
                }
                else {
                  lVar33 = 0;
                  uVar20 = 0;
                  do {
                    uVar19 = *(uint *)((long)pAVar16->pNtk->vObjs->pArray
                                             [(pAVar16->vFanins).pArray[lVar33]] + 0x14) >> 0xc;
                    if (uVar19 < uVar20) {
                      uVar19 = uVar20;
                    }
                    uVar20 = uVar19;
                    lVar33 = lVar33 + 1;
                  } while (lVar26 != lVar33);
                  uVar20 = uVar20 * 0x1000 + 0x1000;
                }
                *(uint *)&pAVar16->field_0x14 = *(uint *)&pAVar16->field_0x14 & 0xfff | uVar20;
                local_10c = local_10c + 1;
                if (uVar20 >> 0xc < *(uint *)&pAVar3->field_0x14 >> 0xc) {
                  *(uint *)&pAVar3->field_0x14 = *(uint *)&pAVar3->field_0x14 & 0xfff | uVar20;
                  local_110 = local_110 + 1;
                }
                else {
                  Abc_NtkDeleteObj_rec(pAVar16,1);
                }
              }
            }
          }
        }
LAB_00268921:
        lVar9 = lVar9 + 1;
        pVVar13 = pNtk->vObjs;
      } while (lVar9 < pVVar13->nSize);
    }
    Extra_ProgressBarStop(p_01);
    if (pManScl->uVars != (uint **)0x0) {
      free(pManScl->uVars);
      pManScl->uVars = (uint **)0x0;
    }
    if (pManScl->uSims != (uint **)0x0) {
      free(pManScl->uSims);
      pManScl->uSims = (uint **)0x0;
    }
    if (local_140 != (uint **)0x0) {
      free(local_140);
    }
    free(pManScl);
    Abc_NtkManCutStop(p_00);
    Cut_ManStop(p);
    lVar9 = (long)pNtk->vCos->nSize;
    if (lVar9 < 1) {
      uVar23 = 0;
    }
    else {
      lVar26 = 0;
      uVar23 = 0;
      do {
        plVar32 = (long *)pNtk->vCos->pArray[lVar26];
        plVar32 = *(long **)(*(long *)(*(long *)(*plVar32 + 0x20) + 8) +
                            (long)*(int *)plVar32[4] * 8);
        if (*(int *)((long)plVar32 + 0x1c) == 1) {
          plVar32 = *(long **)(*(long *)(*(long *)(*plVar32 + 0x20) + 8) +
                              (long)*(int *)plVar32[4] * 8);
        }
        uVar20 = *(uint *)((long)plVar32 + 0x14) >> 0xc;
        if ((uint)uVar23 <= uVar20) {
          uVar23 = (ulong)uVar20;
        }
        lVar26 = lVar26 + 1;
      } while (lVar9 != lVar26);
    }
    if (fVerbose != 0) {
      printf("Try = %d. Dec = %d. Exist = %d. Use = %d. SUPER = %d levels of %d-LUTs.\n",
             (ulong)local_104,(ulong)local_108,(ulong)local_10c,(ulong)local_110,uVar23,nLutSize);
    }
    lVar9 = (long)pNtk->vObjs->nSize;
    if (0 < lVar9) {
      ppvVar7 = pNtk->vObjs->pArray;
      lVar26 = 0;
      do {
        pvVar14 = ppvVar7[lVar26];
        if (pvVar14 != (void *)0x0) {
          *(undefined8 *)((long)pvVar14 + 8) = 0;
        }
        lVar26 = lVar26 + 1;
      } while (lVar9 != lVar26);
    }
    iVar28 = Abc_NtkCheck(pNtk);
    iVar30 = 1;
    if (iVar28 == 0) {
      puts("Abc_NtkSuperChoiceLut: The network check has failed.");
      iVar30 = 0;
    }
  }
  else {
    iVar30 = 0;
    printf("Cut size (%d) does not belong to the interval: LUT size (%d) < Cut size <= %d\n",
           (ulong)(uint)nCutSizeMax,uVar23,0xf);
  }
  return iVar30;
}

Assistant:

int Abc_NtkSuperChoiceLut( Abc_Ntk_t * pNtk, int nLutSize, int nCutSizeMax, int fVerbose )
{
    ProgressBar * pProgress;
    Abc_ManCut_t * pManCut;
    Abc_ManScl_t * pManScl;
    Cut_Man_t * pManCuts;
    Abc_Obj_t * pObj, * pFanin, * pObjTop;
    int i, LevelMax, nNodes;
    int nNodesTried, nNodesDec, nNodesExist, nNodesUsed;

    assert( Abc_NtkIsSopLogic(pNtk) );
    if ( nLutSize < 3 || nLutSize > SCL_LUT_MAX )
    {
        printf( "LUT size (%d) does not belong to the interval: 3 <= LUT size <= %d\n", nLutSize, SCL_LUT_MAX );
        return 0;
    }
    if ( nCutSizeMax <= nLutSize || nCutSizeMax > SCL_VARS_MAX )
    {
        printf( "Cut size (%d) does not belong to the interval: LUT size (%d) < Cut size <= %d\n", nCutSizeMax, nLutSize, SCL_VARS_MAX );
        return 0;
    }

    assert( nLutSize <= SCL_LUT_MAX );
    assert( nCutSizeMax <= SCL_VARS_MAX );
    nNodesTried = nNodesDec = nNodesExist = nNodesUsed = 0;

    // set the delays of the CIs
    Abc_NtkForEachCi( pNtk, pObj, i )
        pObj->Level = 0;

//Abc_NtkLevel( pNtk );
 
    // start the managers
    pManScl = Abc_ManSclStart( nLutSize, nCutSizeMax, 1000 );
    pManCuts = Abc_NtkStartCutManForScl( pNtk, nLutSize );
    pManCut = Abc_NtkManCutStart( nCutSizeMax, 100000, 100000, 100000 );
    s_pLeaves = Abc_NtkManCutReadCutSmall( pManCut );
    pManScl->vVolume = Abc_NtkManCutReadVisited( pManCut );

    // process each internal node (assuming topological order of nodes!!!)
    nNodes = Abc_NtkObjNumMax(pNtk);
    pProgress = Extra_ProgressBarStart( stdout, nNodes );
    Abc_NtkForEachObj( pNtk, pObj, i )
    {
//        if ( i != nNodes-1 )
//            continue;
        Extra_ProgressBarUpdate( pProgress, i, NULL );
        if ( i >= nNodes )
            break;
        if ( Abc_ObjFaninNum(pObj) != 2 )
            continue;
        nNodesTried++;

        // map this node using regular cuts
//        pObj->Level = 0;
        Abc_NodeLutMap( pManCuts, pObj );
        // compute the cut
        pManScl->vLeaves = Abc_NodeFindCut( pManCut, pObj, 0 );
        if ( Vec_PtrSize(pManScl->vLeaves) <= nLutSize )
            continue;
        // get the volume of the cut
        if ( Vec_PtrSize(pManScl->vVolume) > SCL_NODE_MAX )
            continue;
        nNodesDec++;

        // decompose the cut
        pObjTop = Abc_NodeSuperChoiceLut( pManScl, pObj );
        if ( pObjTop == NULL )
            continue;
        nNodesExist++;

        // if there is no delay improvement, skip; otherwise, update level
        if ( pObjTop->Level >= pObj->Level )
        {
            Abc_NtkDeleteObj_rec( pObjTop, 1 );
            continue;
        }
        pObj->Level = pObjTop->Level;
        nNodesUsed++;
    }
    Extra_ProgressBarStop( pProgress );

    // delete the managers
    Abc_ManSclStop( pManScl );
    Abc_NtkManCutStop( pManCut );
    Cut_ManStop( pManCuts );

    // get the largest arrival time
    LevelMax = 0;
    Abc_NtkForEachCo( pNtk, pObj, i )
    {
        pFanin = Abc_ObjFanin0( pObj );
        // skip inv/buf
        if ( Abc_ObjFaninNum(pFanin) == 1 )
            pFanin = Abc_ObjFanin0( pFanin );
        // get the new level
        LevelMax = Abc_MaxInt( LevelMax, (int)pFanin->Level );
    }

    if ( fVerbose )
    printf( "Try = %d. Dec = %d. Exist = %d. Use = %d. SUPER = %d levels of %d-LUTs.\n", 
        nNodesTried, nNodesDec, nNodesExist, nNodesUsed, LevelMax, nLutSize );
//    if ( fVerbose )
//    printf( "The network is superchoiced for %d levels of %d-LUTs.\n", LevelMax, nLutSize );

    // clean the data field
    Abc_NtkForEachObj( pNtk, pObj, i )
        pObj->pNext = NULL;

    // check
    if ( !Abc_NtkCheck( pNtk ) )
    {
        printf( "Abc_NtkSuperChoiceLut: The network check has failed.\n" );
        return 0;
    }
    return 1;
}